

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O2

string * __thiscall
pbrt::BSSRDFTable::ToString_abi_cxx11_(string *__return_storage_ptr__,BSSRDFTable *this)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffff0;
  
  StringPrintf<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ BSSRDFTable rhoSamples: %s radiusSamples: %s profile: %s rhoEff: %s profileCDF: %s ]"
             ,(char *)this,&this->radiusSamples,&this->profile,&this->rhoEff,&this->profileCDF,
             in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string BSSRDFTable::ToString() const {
    return StringPrintf("[ BSSRDFTable rhoSamples: %s radiusSamples: %s profile: %s "
                        "rhoEff: %s profileCDF: %s ]",
                        rhoSamples, radiusSamples, profile, rhoEff, profileCDF);
}